

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void doctest::detail::logAssertThrowsAs
               (bool threw,bool threw_as,char *as,char *expr,Enum assert_type,char *file,int line)

{
  char *pcVar1;
  Code code;
  undefined7 in_register_00000031;
  Color *pCVar2;
  char msg [1024];
  char info1 [1024];
  char loc [1024];
  String local_c60;
  String local_c58;
  String local_c50;
  String local_c48;
  String local_c40;
  char local_c38 [1024];
  Color local_838 [1024];
  char local_438 [1032];
  
  pcVar1 = fileForOutput(file);
  snprintf(local_438,0x400,"%s(%d)",pcVar1,(ulong)(uint)line);
  if ((int)CONCAT71(in_register_00000031,threw_as) == 0) {
    pcVar1 = "(didn\'t throw at all)";
    if (threw) {
      pcVar1 = "(threw something else)";
    }
    snprintf(local_c38,0x400," FAILED! %s\n",pcVar1);
  }
  else {
    builtin_strncpy(local_c38," PASSED!\n",10);
  }
  pcVar1 = getAssertString(assert_type);
  pCVar2 = local_838;
  snprintf((char *)pCVar2,0x400,"  %s( %s, %s )\n\n",pcVar1,expr,as);
  if (local_438[0] != '\0') {
    Color::use(pCVar2,LightGrey);
    pCVar2 = (Color *)0x14b3ce;
    printf("%s");
    Color::use(pCVar2,None);
  }
  if (local_c38[0] != '\0') {
    code = Red;
    if (threw_as) {
      code = BrightGreen;
    }
    Color::use(pCVar2,code);
    pCVar2 = (Color *)0x14b3ce;
    printf("%s");
    Color::use(pCVar2,None);
  }
  if (local_838[0] != (Color)0x0) {
    Color::use(pCVar2,Cyan);
    pCVar2 = (Color *)0x14b3ce;
    printf("%s");
    Color::use(pCVar2,None);
  }
  String::String(&local_c50,local_438);
  String::String(&local_c58,local_c38);
  String::operator+(&local_c48,&local_c50);
  String::String(&local_c60,(char *)local_838);
  String::operator+(&local_c40,&local_c48);
  free(local_c40.m_str);
  free(local_c60.m_str);
  free(local_c48.m_str);
  free(local_c58.m_str);
  free(local_c50.m_str);
  return;
}

Assistant:

void logAssertThrowsAs(bool threw, bool threw_as, const char* as, const char* expr,
                           assertType::Enum assert_type, const char* file, int line) {
        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        if(threw_as)
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " PASSED!\n");
        else
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " FAILED! %s\n",
                             (threw ? "(threw something else)" : "(didn't throw at all)"));

        char info1[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(info1, DOCTEST_COUNTOF(info1), "  %s( %s, %s )\n\n",
                         getAssertString(assert_type), expr, as);

        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, threw_as ? Color::BrightGreen : Color::Red);
        DOCTEST_PRINTF_COLORED(info1, Color::Cyan);

        printToDebugConsole(String(loc) + msg + info1);
    }